

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_device.c
# Opt level: O2

int device_main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  int ip_mode;
  uint portTemp;
  char *local_48;
  char *local_40;
  char *local_38;
  
  portTemp = 0;
  ip_mode = 1;
  SampleUtil_Initialize(linux_print);
  iVar7 = 1;
  local_48 = (char *)0x0;
  local_38 = (char *)0x0;
  local_40 = (char *)0x0;
  do {
    if (argc <= iVar7) {
      iVar7 = TvDeviceStart(local_48,(unsigned_short)portTemp,local_38,local_40,ip_mode,linux_print,
                            0);
      return iVar7;
    }
    pcVar6 = argv[iVar7];
    cVar1 = *pcVar6;
    if (((cVar1 == '-') && (pcVar6[1] == 'i')) && (pcVar6[2] == '\0')) {
      iVar2 = iVar7 + 1;
      local_48 = argv[(long)iVar7 + 1];
    }
    else {
      iVar2 = strcmp(pcVar6,"-port");
      if (iVar2 == 0) {
        pcVar6 = argv[(long)iVar7 + 1];
        pcVar5 = "%u";
        puVar4 = &portTemp;
LAB_00107852:
        iVar2 = iVar7 + 1;
        __isoc99_sscanf(pcVar6,pcVar5,puVar4);
      }
      else {
        iVar2 = strcmp(pcVar6,"-desc");
        if (iVar2 == 0) {
          iVar2 = iVar7 + 1;
          local_38 = argv[(long)iVar7 + 1];
        }
        else {
          iVar2 = strcmp(pcVar6,"-webdir");
          if (iVar2 == 0) {
            iVar2 = iVar7 + 1;
            local_40 = argv[(long)iVar7 + 1];
          }
          else {
            if (((cVar1 == '-') && (pcVar6[1] == 'm')) && (pcVar6[2] == '\0')) {
              pcVar6 = argv[(long)iVar7 + 1];
              pcVar5 = "%d";
              puVar4 = (uint *)&ip_mode;
              goto LAB_00107852;
            }
            iVar3 = strcmp(pcVar6,"-help");
            iVar2 = iVar7;
            if (iVar3 == 0) {
              SampleUtil_Print("Usage: %s -i interface -port port -desc desc_doc_name -webdir web_dir_path -m ip_mode -help (this message)\n"
                               ,*argv);
              SampleUtil_Print(
                              "\tinterface:     interface address of the device (must match desc. doc)\n\t\te.g.: eth0\n\tport:          Port number to use for receiving UPnP messages (must match desc. doc)\n\t\te.g.: 5431\n\tdesc_doc_name: name of device description document\n\t\te.g.: tvdevicedesc.xml\n\tweb_dir_path:  Filesystem path where web files related to the device are stored\n\t\te.g.: /upnp/sample/tvdevice/web\n\tip_mode:       set to 1 for IPv4 (default), 2 for IPv6 LLA and 3 for IPv6 ULA or GUA\n"
                              );
              return 1;
            }
          }
        }
      }
    }
    iVar7 = iVar2 + 1;
  } while( true );
}

Assistant:

int device_main(int argc, char *argv[])
{
	unsigned int portTemp = 0;
	char *iface = NULL;
	char *desc_doc_name = NULL;
	char *web_dir_path = NULL;
	unsigned short port = 0;
	int ip_mode = IP_MODE_IPV4;
	int i = 0;

	SampleUtil_Initialize(linux_print);
	/* Parse options */
	for (i = 1; i < argc; i++) {
		if (strcmp(argv[i], "-i") == 0) {
			iface = argv[++i];
		} else if (strcmp(argv[i], "-port") == 0) {
#ifdef WIN32
			sscanf_s(argv[++i], "%u", &portTemp);
#else
			sscanf(argv[++i], "%u", &portTemp);
#endif
		} else if (strcmp(argv[i], "-desc") == 0) {
			desc_doc_name = argv[++i];
		} else if (strcmp(argv[i], "-webdir") == 0) {
			web_dir_path = argv[++i];
		} else if (strcmp(argv[i], "-m") == 0) {
#ifdef _WIN32
			sscanf_s(argv[++i], "%d", &ip_mode);
#else
			sscanf(argv[++i], "%d", &ip_mode);
#endif
		} else if (strcmp(argv[i], "-help") == 0) {
			SampleUtil_Print(
				"Usage: %s -i interface -port port"
				" -desc desc_doc_name -webdir web_dir_path"
				" -m ip_mode -help (this message)\n",
				argv[0]);
			SampleUtil_Print(
				"\tinterface:     interface address of the "
				"device"
				" (must match desc. doc)\n"
				"\t\te.g.: eth0\n"
				"\tport:          Port number to use for"
				" receiving UPnP messages (must match desc. "
				"doc)\n"
				"\t\te.g.: 5431\n"
				"\tdesc_doc_name: name of device description "
				"document\n"
				"\t\te.g.: tvdevicedesc.xml\n"
				"\tweb_dir_path:  Filesystem path where web "
				"files"
				" related to the device are stored\n"
				"\t\te.g.: /upnp/sample/tvdevice/web\n"
				"\tip_mode:       set to 1 for IPv4 (default), "
				"2 for IPv6 LLA and 3 for IPv6 ULA or GUA\n");
			return 1;
		}
	}
	port = (unsigned short)portTemp;
	return TvDeviceStart(iface,
		port,
		desc_doc_name,
		web_dir_path,
		ip_mode,
		linux_print,
		0);
}